

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_yield_distribution.cpp
# Opt level: O0

void __thiscall
particle_yield_distribution::collect_particle_yield(particle_yield_distribution *this,int event_id)

{
  int iVar1;
  ostream *poVar2;
  void *this_00;
  long in_RDI;
  double dVar3;
  int idx;
  double p_perp_1;
  double py_local_1;
  double px_local_1;
  double pmag_1;
  double mass_1;
  double rap_local_1;
  double E_local_1;
  double pz_local_1;
  int i_1;
  int number_of_anti_particles;
  int count_anti_particle;
  double p_perp;
  double py_local;
  double px_local;
  double pmag;
  double mass;
  double rap_local;
  double E_local;
  double pz_local;
  int i;
  int count;
  int number_of_particles;
  int in_stack_fffffffffffffa8c;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  undefined4 in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  double local_530;
  double local_4b8;
  double local_440;
  double local_3c8;
  double local_390;
  double local_318;
  int local_2bc;
  int local_2b4;
  double local_288;
  double local_210;
  double local_198;
  double local_120;
  double local_e8;
  double local_70;
  int local_18;
  int local_14;
  
  std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x18124c);
  iVar1 = particleSamples::get_number_of_particles
                    ((particleSamples *)
                     CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                     in_stack_fffffffffffffa8c);
  local_14 = 0;
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x18129a);
    particleSamples::get_particle
              ((particleSamples *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1812d8);
    particleSamples::get_particle
              ((particleSamples *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    if (*(int *)(in_RDI + 0x1f8) == 0) {
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x181328);
      particleSamples::get_particle
                ((particleSamples *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      dVar3 = sqrt(local_e8 * local_e8 + -(local_198 * local_198));
      local_120 = log((dVar3 + local_70) / (dVar3 - local_70));
    }
    else {
      local_120 = log((local_e8 + local_70) / (local_e8 - local_70));
    }
    local_120 = local_120 * 0.5;
    if ((*(double *)(in_RDI + 0x200) <= local_120 && local_120 != *(double *)(in_RDI + 0x200)) &&
       (local_120 < *(double *)(in_RDI + 0x208))) {
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x18147f);
      particleSamples::get_particle
                ((particleSamples *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1814bd);
      particleSamples::get_particle
                ((particleSamples *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      dVar3 = sqrt(local_210 * local_210 + local_288 * local_288);
      if ((*(double *)(in_RDI + 0x1e8) <= dVar3 && dVar3 != *(double *)(in_RDI + 0x1e8)) &&
         (dVar3 < *(double *)(in_RDI + 0x1f0))) {
        local_14 = local_14 + 1;
      }
    }
  }
  local_2b4 = 0;
  if (*(int *)(in_RDI + 0x1dc) == 1) {
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1815b1);
    iVar1 = particleSamples::get_number_of_anti_particles
                      ((particleSamples *)
                       CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                       in_stack_fffffffffffffa8c);
    for (local_2bc = 0; local_2bc < iVar1; local_2bc = local_2bc + 1) {
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1815f4);
      particleSamples::get_anti_particle
                ((particleSamples *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x181632);
      particleSamples::get_anti_particle
                ((particleSamples *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      if (*(int *)(in_RDI + 0x1f8) == 0) {
        std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x181682);
        particleSamples::get_anti_particle
                  ((particleSamples *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        dVar3 = sqrt(local_390 * local_390 + -(local_440 * local_440));
        local_3c8 = log((dVar3 + local_318) / (dVar3 - local_318));
      }
      else {
        local_3c8 = log((local_390 + local_318) / (local_390 - local_318));
      }
      local_3c8 = local_3c8 * 0.5;
      if ((*(double *)(in_RDI + 0x200) <= local_3c8 && local_3c8 != *(double *)(in_RDI + 0x200)) &&
         (local_3c8 < *(double *)(in_RDI + 0x208))) {
        std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x1817d9);
        particleSamples::get_anti_particle
                  ((particleSamples *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x181817);
        particleSamples::get_anti_particle
                  ((particleSamples *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        dVar3 = sqrt(local_4b8 * local_4b8 + local_530 * local_530);
        if ((*(double *)(in_RDI + 0x1e8) <= dVar3 && dVar3 != *(double *)(in_RDI + 0x1e8)) &&
           (dVar3 < *(double *)(in_RDI + 0x1f0))) {
          local_2b4 = local_2b4 + 1;
        }
      }
    }
  }
  iVar1 = (local_14 - local_2b4) + *(int *)(in_RDI + 0x214) / 2;
  if ((-1 < iVar1) && (iVar1 <= *(int *)(in_RDI + 0x214) + -1)) {
    *(int *)(*(long *)(in_RDI + 0x218) + (long)iVar1 * 4) =
         *(int *)(*(long *)(in_RDI + 0x218) + (long)iVar1 * 4) + 1;
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"particle number is out of bound!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"bound: [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,-*(int *)(in_RDI + 0x214) / 2);
  poVar2 = std::operator<<(poVar2," , ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x214) / 2);
  poVar2 = std::operator<<(poVar2,"]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"count = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
  poVar2 = std::operator<<(poVar2,", count_anti_particle = ");
  this_00 = (void *)std::ostream::operator<<(poVar2,local_2b4);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void particle_yield_distribution::collect_particle_yield(int event_id) {
    int number_of_particles = particle_list->get_number_of_particles(event_id);

    int count = 0;
    for (int i = 0; i < number_of_particles; i++) {
        double pz_local = particle_list->get_particle(event_id, i).pz;
        double E_local = particle_list->get_particle(event_id, i).E;

        double rap_local;
        if (rap_type == 0) {
            double mass = particle_list->get_particle(event_id, i).mass;
            double pmag = sqrt(E_local * E_local - mass * mass);
            rap_local = 0.5 * log((pmag + pz_local) / (pmag - pz_local));
        } else {
            rap_local = 0.5 * log((E_local + pz_local) / (E_local - pz_local));
        }

        if (rap_local > rap_min && rap_local < rap_max) {
            double px_local = particle_list->get_particle(event_id, i).px;
            double py_local = particle_list->get_particle(event_id, i).py;
            double p_perp = sqrt(px_local * px_local + py_local * py_local);
            if (p_perp > pT_min && p_perp < pT_max) {
                count++;
            }
        }
    }
    int count_anti_particle = 0;
    if (net_particle_flag == 1) {
        int number_of_anti_particles =
            particle_list->get_number_of_anti_particles(event_id);
        for (int i = 0; i < number_of_anti_particles; i++) {
            double pz_local = particle_list->get_anti_particle(event_id, i).pz;
            double E_local = particle_list->get_anti_particle(event_id, i).E;

            double rap_local;
            if (rap_type == 0) {
                double mass =
                    particle_list->get_anti_particle(event_id, i).mass;
                double pmag = sqrt(E_local * E_local - mass * mass);
                rap_local = 0.5 * log((pmag + pz_local) / (pmag - pz_local));
            } else {
                rap_local =
                    0.5 * log((E_local + pz_local) / (E_local - pz_local));
            }

            if (rap_local > rap_min && rap_local < rap_max) {
                double px_local =
                    particle_list->get_anti_particle(event_id, i).px;
                double py_local =
                    particle_list->get_anti_particle(event_id, i).py;
                double p_perp = sqrt(px_local * px_local + py_local * py_local);
                if (p_perp > pT_min && p_perp < pT_max) {
                    count_anti_particle++;
                }
            }
        }
    }
    int idx = count - count_anti_particle + n_max / 2;
    if (idx < 0 || idx > n_max - 1) {
        cout << "particle number is out of bound!" << endl;
        cout << "bound: [" << -n_max / 2 << " , " << n_max / 2 << "]" << endl;
        cout << "count = " << count
             << ", count_anti_particle = " << count_anti_particle << endl;
        exit(1);
    }
    number_of_events[idx]++;
}